

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

void __thiscall
pbrt::Disk::Disk(Disk *this,Transform *renderFromObject,Transform *objectFromRender,
                bool reverseOrientation,Float height,Float radius,Float innerRadius,Float phiMax)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar3 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar3;
  this->height = height;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)phiMax),ZEXT816(0) << 0x40,1);
  this->radius = radius;
  this->innerRadius = innerRadius;
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)phiMax));
  this->phiMax = (Float)((uint)!(bool)((byte)uVar2 & 1) * (int)(auVar1._0_4_ * 0.017453292));
  return;
}

Assistant:

Disk(const Transform *renderFromObject, const Transform *objectFromRender,
         bool reverseOrientation, Float height, Float radius, Float innerRadius,
         Float phiMax)
        : renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          transformSwapsHandedness(renderFromObject->SwapsHandedness()),
          height(height),
          radius(radius),
          innerRadius(innerRadius),
          phiMax(Radians(Clamp(phiMax, 0, 360))) {}